

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O0

void __thiscall
CRegexStack::swap_and_pop
          (CRegexStack *this,int *start_ofs,int *str_ofs,size_t *curlen,re_state_id *state,
          re_state_id *final,re_group_register *regs,short *loop_vars,int *iter)

{
  size_t *in_RCX;
  int *in_RDX;
  int *in_RSI;
  CRegexStack *in_RDI;
  re_state_id *in_R8;
  re_state_id *in_R9;
  re_group_register *in_stack_00000008;
  short *in_stack_00000010;
  undefined4 *in_stack_00000018;
  regex_stack_entry *fp;
  
  swap(in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008,in_stack_00000010);
  *in_stack_00000018 = *(undefined4 *)(in_RDI->buf_ + (long)in_RDI->sp_ + 0x1c);
  discard(in_RDI);
  return;
}

Assistant:

void swap_and_pop(int *start_ofs, int *str_ofs, size_t *curlen,
                      re_state_id *state, re_state_id *final,
                      re_group_register *regs, short *loop_vars, int *iter)
    {
        /* swap the current state wtih the top of stack */
        swap(start_ofs, str_ofs, curlen, state, final, regs, loop_vars);

        /* save the return value from the outgoing state */
        regex_stack_entry *fp = (regex_stack_entry *)(buf_ + sp_);
        *iter = fp->iter;

        /* discard the frame */
        discard();
    }